

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceFile.cpp
# Opt level: O0

void __thiscall hdc::SourceFile::addClass(SourceFile *this,Class *klass)

{
  Class *local_18;
  Class *klass_local;
  SourceFile *this_local;
  
  local_18 = klass;
  klass_local = (Class *)this;
  std::vector<hdc::Class_*,_std::allocator<hdc::Class_*>_>::push_back(&this->classes,&local_18);
  Class::setSourceFile(local_18,this);
  ASTNode::setParentNode(&local_18->super_ASTNode,&this->super_ASTNode);
  return;
}

Assistant:

void SourceFile::addClass(Class* klass) {
    classes.push_back(klass);
    klass->setSourceFile(this);
    klass->setParentNode(this);
}